

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::DecodeRawTransactionResponse::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *in_stack_fffffffffffff8c8;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *in_stack_fffffffffffff8d0;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *this;
  char (*in_stack_fffffffffffff8d8) [9];
  char (*__args) [5];
  function<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
  *in_stack_fffffffffffff8e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
  *this_00;
  undefined1 local_5c1 [49];
  char local_590 [103];
  allocator local_529;
  string local_528 [32];
  _Base_ptr local_508;
  undefined1 local_500;
  allocator local_491;
  string local_490 [32];
  _Base_ptr local_470;
  undefined1 local_468;
  allocator local_3f9;
  string local_3f8 [32];
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  allocator local_361;
  string local_360 [32];
  _Base_ptr local_340;
  undefined1 local_338;
  allocator local_2c9;
  string local_2c8 [32];
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  allocator local_231;
  string local_230 [32];
  _Base_ptr local_210;
  undefined1 local_208;
  allocator local_199;
  string local_198 [32];
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  string local_100 [32];
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
                   *)0x4a20c3);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff8d0);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_DecodeRawTransactionResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff8d8
              );
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [5])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"txid",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8d0,(value_type *)in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_DecodeRawTransactionResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff8d8
              );
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [5])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"hash",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8d0,(value_type *)in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_DecodeRawTransactionResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff8d8
              );
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [8])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_210 = (_Base_ptr)pVar2.first._M_node;
    local_208 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"version",&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8d0,(value_type *)in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_DecodeRawTransactionResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff8d8
              );
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [5])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_2a8 = (_Base_ptr)pVar2.first._M_node;
    local_2a0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"size",&local_2c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8d0,(value_type *)in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_DecodeRawTransactionResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff8d8
              );
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [6])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_340 = (_Base_ptr)pVar2.first._M_node;
    local_338 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"vsize",&local_361);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8d0,(value_type *)in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_DecodeRawTransactionResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff8d8
              );
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[7],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [7])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_3d8 = (_Base_ptr)pVar2.first._M_node;
    local_3d0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"weight",&local_3f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8d0,(value_type *)in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_DecodeRawTransactionResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff8d8
              );
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_470 = (_Base_ptr)pVar2.first._M_node;
    local_468 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490,"locktime",&local_491);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8d0,(value_type *)in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string(local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_DecodeRawTransactionResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff8d8
              );
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [4])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_508 = (_Base_ptr)pVar2.first._M_node;
    local_500 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,"vin",&local_529);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8d0,(value_type *)in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    __args = (char (*) [5])local_590;
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionResponse_ptr
                *)__args);
    std::function<void(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_DecodeRawTransactionResponse_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
                      (this_00,__args,in_stack_fffffffffffff8d0);
    local_5c1._33_8_ = pVar2.first._M_node;
    local_5c1[0x29] = pVar2.second;
    this = (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_5c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_5c1 + 1),"vout",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string((string *)(local_5c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_5c1);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              (this);
  }
  return;
}

Assistant:

void DecodeRawTransactionResponse::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<DecodeRawTransactionResponse> func_table;  // NOLINT

  func_table = {
    DecodeRawTransactionResponse::GetTxidString,
    DecodeRawTransactionResponse::SetTxidString,
    DecodeRawTransactionResponse::GetTxidFieldType,
  };
  json_mapper.emplace("txid", func_table);
  item_list.push_back("txid");
  func_table = {
    DecodeRawTransactionResponse::GetHashString,
    DecodeRawTransactionResponse::SetHashString,
    DecodeRawTransactionResponse::GetHashFieldType,
  };
  json_mapper.emplace("hash", func_table);
  item_list.push_back("hash");
  func_table = {
    DecodeRawTransactionResponse::GetVersionString,
    DecodeRawTransactionResponse::SetVersionString,
    DecodeRawTransactionResponse::GetVersionFieldType,
  };
  json_mapper.emplace("version", func_table);
  item_list.push_back("version");
  func_table = {
    DecodeRawTransactionResponse::GetSizeString,
    DecodeRawTransactionResponse::SetSizeString,
    DecodeRawTransactionResponse::GetSizeFieldType,
  };
  json_mapper.emplace("size", func_table);
  item_list.push_back("size");
  func_table = {
    DecodeRawTransactionResponse::GetVsizeString,
    DecodeRawTransactionResponse::SetVsizeString,
    DecodeRawTransactionResponse::GetVsizeFieldType,
  };
  json_mapper.emplace("vsize", func_table);
  item_list.push_back("vsize");
  func_table = {
    DecodeRawTransactionResponse::GetWeightString,
    DecodeRawTransactionResponse::SetWeightString,
    DecodeRawTransactionResponse::GetWeightFieldType,
  };
  json_mapper.emplace("weight", func_table);
  item_list.push_back("weight");
  func_table = {
    DecodeRawTransactionResponse::GetLocktimeString,
    DecodeRawTransactionResponse::SetLocktimeString,
    DecodeRawTransactionResponse::GetLocktimeFieldType,
  };
  json_mapper.emplace("locktime", func_table);
  item_list.push_back("locktime");
  func_table = {
    DecodeRawTransactionResponse::GetVinString,
    DecodeRawTransactionResponse::SetVinString,
    DecodeRawTransactionResponse::GetVinFieldType,
  };
  json_mapper.emplace("vin", func_table);
  item_list.push_back("vin");
  func_table = {
    DecodeRawTransactionResponse::GetVoutString,
    DecodeRawTransactionResponse::SetVoutString,
    DecodeRawTransactionResponse::GetVoutFieldType,
  };
  json_mapper.emplace("vout", func_table);
  item_list.push_back("vout");
}